

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall luna::CodeGenerateVisitor::EnterFunction(CodeGenerateVisitor *this)

{
  GCObject *pGVar1;
  bool bVar2;
  int iVar3;
  GCObject *pGVar4;
  Function *pFVar5;
  String *module;
  GC *in_RDI;
  int index;
  GenerateFunction *parent;
  GenerateFunction *function;
  Function *in_stack_ffffffffffffffb8;
  
  pGVar4 = (GCObject *)operator_new(0x40);
  GenerateFunction::GenerateFunction((GenerateFunction *)0x2202fd);
  pGVar1 = (in_RDI->gen1_).gen_;
  pGVar4->_vptr_GCObject = (_func_int **)pGVar1;
  (in_RDI->gen1_).gen_ = pGVar4;
  pFVar5 = State::NewFunction((State *)0x220336);
  *(Function **)&((in_RDI->gen1_).gen_)->field_0x10 = pFVar5;
  bVar2 = CheckBarrier(*(GCObject **)&((in_RDI->gen1_).gen_)->field_0x10);
  if (bVar2) {
    State::GetGC((State *)0x22036c);
    GC::SetBarrier(in_RDI,&in_stack_ffffffffffffffb8->super_GCObject);
  }
  if (pGVar1 != (GCObject *)0x0) {
    iVar3 = Function::AddChildFunction((Function *)in_RDI,in_stack_ffffffffffffffb8);
    *(int *)&pGVar4[1]._vptr_GCObject = iVar3;
    Function::SetSuperior(*(Function **)&pGVar4->field_0x10,*(Function **)&pGVar1->field_0x10);
    pFVar5 = *(Function **)&pGVar4->field_0x10;
    module = Function::GetModule(*(Function **)&pGVar1->field_0x10);
    Function::SetModuleName(pFVar5,module);
  }
  return;
}

Assistant:

void EnterFunction()
        {
            auto function = new GenerateFunction;
            auto parent = current_function_;
            function->parent_ = parent;
            current_function_ = function;

            // New function is default on GCGen2, so barrier it
            current_function_->function_ = state_->NewFunction();
            CHECK_BARRIER(state_->GetGC(), current_function_->function_);

            if (parent)
            {
                auto index = parent->function_->AddChildFunction(function->function_);
                function->func_index_ = index;
                function->function_->SetSuperior(parent->function_);
                function->function_->SetModuleName(parent->function_->GetModule());
            }
        }